

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O3

void m2d::savanna::load_root_cert(string *cert,context *ctx)

{
  SSL_CTX *ctx_00;
  error_code ec_00;
  X509 *pXVar1;
  int iVar2;
  undefined4 extraout_var;
  system_error *this;
  X509_STORE_CTX *ca;
  error_code ec;
  undefined1 local_88 [16];
  X509 *local_78;
  error_category *peStack_70;
  undefined8 local_68;
  error_category *peStack_60;
  undefined1 local_58 [16];
  X509 *local_48;
  error_category *peStack_40;
  _Alloc_hider local_38;
  X509_VERIFY_PARAM *local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_28;
  
  boost::system::error_code::error_code((error_code *)local_88);
  local_58._0_8_ = (cert->_M_dataplus)._M_p;
  local_58._8_8_ = cert->_M_string_length;
  ca = (X509_STORE_CTX *)local_58;
  boost::asio::ssl::context::add_certificate_authority
            (ctx,(const_buffer *)ca,(error_code *)local_88);
  if (local_88[4] == true) {
    this = (system_error *)__cxa_allocate_exception(0x40);
    ec_00.failed_ = local_88[4];
    ec_00.val_ = local_88._0_4_;
    ec_00._5_11_ = local_88._5_11_;
    boost::system::system_error::system_error(this,ec_00);
    __cxa_throw(this,&boost::system::system_error::typeinfo,
                boost::system::system_error::~system_error);
  }
  boost::system::error_code::error_code((error_code *)&local_68);
  ctx_00 = (SSL_CTX *)ctx->handle_;
  iVar2 = SSL_CTX_get_verify_callback((int)ctx_00,ca);
  SSL_CTX_set_verify(ctx_00,1,(callback *)CONCAT44(extraout_var,iVar2));
  boost::system::error_code::error_code((error_code *)local_58);
  local_68 = (X509 *)local_58._0_8_;
  pXVar1 = local_68;
  peStack_60 = (error_category *)local_58._8_8_;
  local_68._4_1_ = SUB81(local_58._0_8_,4);
  if (local_68._4_1_ != true) {
    return;
  }
  local_78 = (X509 *)local_58._0_8_;
  peStack_70 = (error_category *)local_58._8_8_;
  local_68 = pXVar1;
  std::runtime_error::runtime_error((runtime_error *)local_58,"set_verify_mode");
  local_58._0_8_ = &PTR__system_error_00217040;
  local_48 = local_78;
  peStack_40 = peStack_70;
  local_38._M_p = (pointer)&local_28;
  local_30 = (X509_VERIFY_PARAM *)0x0;
  local_28._M_local_buf[0] = '\0';
  boost::throw_exception<boost::system::system_error>((system_error *)local_58);
}

Assistant:

static void load_root_cert(std::string const &cert, ssl::context &ctx)
	{
		boost::system::error_code ec;
		ctx.add_certificate_authority(boost::asio::buffer(cert.data(), cert.size()), ec);
		if (ec) {
			throw beast::system_error { ec };
		}

		ctx.set_verify_mode(ssl::verify_peer);
	}